

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundMutation.cpp
# Opt level: O0

void __thiscall CompoundMutation::print(CompoundMutation *this,ostream *os)

{
  ostream *poVar1;
  void *pvVar2;
  size_type sVar3;
  __shared_ptr_access<MutationComponent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  int local_1c;
  int i;
  ostream *os_local;
  CompoundMutation *this_local;
  
  poVar1 = std::operator<<(os,"HEALTH SHARE ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MutationComponent).health);
  poVar1 = std::operator<<(poVar1," / 100");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"PRODUCTIVITY SHARE ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MutationComponent).productivity);
  poVar1 = std::operator<<(poVar1," / 100");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"SIZE SWITCH ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(this->super_MutationComponent).size);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"SAFETY SWITCH ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(this->super_MutationComponent).safety);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"VELOCITY SWITCH ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(this->super_MutationComponent).velocity);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"COVER SWITCH ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(this->super_MutationComponent).cover);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(os,"~~~~~~~~~~~~~~~CHILDREN_BEGIN~~~~~~~~~~~~~~~~~~");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1c = 0;
  while( true ) {
    sVar3 = std::
            vector<std::shared_ptr<MutationComponent>,_std::allocator<std::shared_ptr<MutationComponent>_>_>
            ::size(&this->children);
    if (sVar3 <= (ulong)(long)local_1c) break;
    this_00 = (__shared_ptr_access<MutationComponent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<MutationComponent>,_std::allocator<std::shared_ptr<MutationComponent>_>_>
              ::operator[](&this->children,(long)local_1c);
    peVar4 = std::__shared_ptr_access<MutationComponent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar4->_vptr_MutationComponent[1])(peVar4,os);
    local_1c = local_1c + 1;
  }
  poVar1 = std::operator<<(os,"~~~~~~~~~~~~~~~CHILDREN_END~~~~~~~~~~~~~~~~~~");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CompoundMutation::print(std::ostream &os) {
  os << "HEALTH SHARE " << health << " / 100" << std::endl;
  os << "PRODUCTIVITY SHARE " << productivity << " / 100" << std::endl;
  os << "SIZE SWITCH " << size << std::endl;
  os << "SAFETY SWITCH " << safety << std::endl;
  os << "VELOCITY SWITCH " << velocity << std::endl;
  os << "COVER SWITCH " << cover << std::endl;
  os << "~~~~~~~~~~~~~~~CHILDREN_BEGIN~~~~~~~~~~~~~~~~~~" << std::endl;
  for (int i = 0; i < children.size(); ++i) {
    children[i]->print(os);
  }
  os << "~~~~~~~~~~~~~~~CHILDREN_END~~~~~~~~~~~~~~~~~~" << std::endl;
}